

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this4.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  shared_ptr<A> p;
  shared_ptr<A> x;
  undefined1 auStack_28 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  std::__shared_ptr<A,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::allocator<A>>
            ((__shared_ptr<A,(__gnu_cxx::_Lock_policy)2> *)(auStack_28 + 0x10),
             (allocator<A> *)auStack_28);
  A::f((A *)auStack_28);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_28._8_8_);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	shared_ptr<A> x = make_shared<A>();
	shared_ptr<A> p = x->f();
	return 0;
}